

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockTHUMB59Tc
               (uint block_part1,uint block_part2,uint8 *img,int width,int height,int startx,
               int starty,int channels)

{
  undefined1 uVar1;
  long lVar2;
  int in_ECX;
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  uint8 y;
  uint8 x;
  uint8 block_mask [4] [4];
  uint8 distance;
  uint8 paint_colors [4] [3];
  uint8 colors [2] [3];
  uint8 colorsRGB444 [2] [3];
  byte local_4a;
  byte local_49;
  byte local_48 [8];
  uint8 (*in_stack_ffffffffffffffc0) [3];
  undefined3 in_stack_ffffffffffffffc8;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffcc;
  uint8 in_stack_ffffffffffffffd6;
  uint8 in_stack_ffffffffffffffd7;
  uint8 local_28 [6];
  byte local_22;
  byte local_21;
  byte local_20;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  int local_1c;
  int local_14;
  long local_10;
  uint local_8;
  
  local_22 = (byte)(in_EDI >> 0x17) & 0xf;
  local_21 = (byte)(in_EDI >> 0x13) & 0xf;
  local_20 = (byte)(in_EDI >> 0xf) & 0xf;
  local_1f = (byte)(in_EDI >> 0xb) & 0xf;
  local_1e = (byte)(in_EDI >> 7) & 0xf;
  local_1d = (byte)(in_EDI >> 3) & 0xf;
  uVar3 = CONCAT13((char)in_EDI,in_stack_ffffffffffffffc8) & 0x7ffffff;
  local_1c = in_R9D;
  local_14 = in_ECX;
  local_10 = in_RDX;
  local_8 = in_ESI;
  decompressColor(4,4,4,(uint8 (*) [3])&local_22,(uint8 (*) [3])local_28);
  calculatePaintColors59T
            (in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd6,
             (uint8 (*) [3])CONCAT44(in_stack_ffffffffffffffcc,uVar3),in_stack_ffffffffffffffc0);
  for (local_49 = 0; local_49 < 4; local_49 = local_49 + 1) {
    for (local_4a = 0; local_4a < 4; local_4a = local_4a + 1) {
      local_48[(ulong)local_4a + (ulong)local_49 * 4] =
           (byte)((local_8 >> (local_4a + local_49 * '\x04' + 0x10 & 0x1f) & 1) << 1);
      lVar2 = (ulong)local_49 * 4 + -0x48;
      local_48[(ulong)local_4a + lVar2 + 0x48] =
           local_48[(ulong)local_4a + lVar2 + 0x48] |
           (byte)(local_8 >> (local_4a + local_49 * '\x04' & 0x1f)) & 1;
      if ((int)(uint)(byte)(&stack0xffffffffffffffcc)
                           [(ulong)local_48[(ulong)local_4a + (ulong)local_49 * 4] * 3] < 0) {
        uVar1 = 0;
      }
      else if ((byte)(&stack0xffffffffffffffcc)
                     [(ulong)local_48[(ulong)local_4a + (ulong)local_49 * 4] * 3] < 0x100) {
        uVar1 = (&stack0xffffffffffffffcc)
                [(ulong)local_48[(ulong)local_4a + (ulong)local_49 * 4] * 3];
      }
      else {
        uVar1 = 0xff;
      }
      *(undefined1 *)
       (local_10 +
       (int)(in_stack_00000010 *
            ((in_stack_00000008 + (uint)local_4a) * local_14 + local_1c + (uint)local_49))) = uVar1;
      if ((int)(uint)(byte)(&stack0xffffffffffffffcd)
                           [(ulong)local_48[(ulong)local_4a + (ulong)local_49 * 4] * 3] < 0) {
        uVar1 = 0;
      }
      else if ((byte)(&stack0xffffffffffffffcd)
                     [(ulong)local_48[(ulong)local_4a + (ulong)local_49 * 4] * 3] < 0x100) {
        uVar1 = (&stack0xffffffffffffffcd)
                [(ulong)local_48[(ulong)local_4a + (ulong)local_49 * 4] * 3];
      }
      else {
        uVar1 = 0xff;
      }
      *(undefined1 *)
       (local_10 +
       (int)(in_stack_00000010 *
             ((in_stack_00000008 + (uint)local_4a) * local_14 + local_1c + (uint)local_49) + 1)) =
           uVar1;
      if ((int)(uint)(byte)(&stack0xffffffffffffffce)
                           [(ulong)local_48[(ulong)local_4a + (ulong)local_49 * 4] * 3] < 0) {
        uVar1 = 0;
      }
      else if ((byte)(&stack0xffffffffffffffce)
                     [(ulong)local_48[(ulong)local_4a + (ulong)local_49 * 4] * 3] < 0x100) {
        uVar1 = (&stack0xffffffffffffffce)
                [(ulong)local_48[(ulong)local_4a + (ulong)local_49 * 4] * 3];
      }
      else {
        uVar1 = 0xff;
      }
      *(undefined1 *)
       (local_10 +
       (int)(in_stack_00000010 *
             ((in_stack_00000008 + (uint)local_4a) * local_14 + local_1c + (uint)local_49) + 2)) =
           uVar1;
    }
  }
  return;
}

Assistant:

void decompressBlockTHUMB59Tc(unsigned int block_part1, unsigned int block_part2, uint8 *img,int width,int height,int startx,int starty, int channels)
{
	uint8 colorsRGB444[2][3];
	uint8 colors[2][3];
	uint8 paint_colors[4][3];
	uint8 distance;
	uint8 block_mask[4][4];

	// First decode left part of block.
	colorsRGB444[0][R]= GETBITSHIGH(block_part1, 4, 58);
	colorsRGB444[0][G]= GETBITSHIGH(block_part1, 4, 54);
	colorsRGB444[0][B]= GETBITSHIGH(block_part1, 4, 50);

	colorsRGB444[1][R]= GETBITSHIGH(block_part1, 4, 46);
	colorsRGB444[1][G]= GETBITSHIGH(block_part1, 4, 42);
	colorsRGB444[1][B]= GETBITSHIGH(block_part1, 4, 38);

	distance   = GETBITSHIGH(block_part1, TABLE_BITS_59T, 34);

	// Extend the two colors to RGB888	
	decompressColor(R_BITS59T, G_BITS59T, B_BITS59T, colorsRGB444, colors);	
	calculatePaintColors59T(distance, PATTERN_T, colors, paint_colors);
	
	// Choose one of the four paint colors for each texel
	for (uint8 x = 0; x < BLOCKWIDTH; ++x) 
	{
		for (uint8 y = 0; y < BLOCKHEIGHT; ++y) 
		{
			//block_mask[x][y] = GETBITS(block_part2,2,31-(y*4+x)*2);
			block_mask[x][y] = GETBITS(block_part2,1,(y+x*4)+16)<<1;
			block_mask[x][y] |= GETBITS(block_part2,1,(y+x*4));
			img[channels*((starty+y)*width+startx+x)+R] =
				CLAMP(0,paint_colors[block_mask[x][y]][R],255); // RED
			img[channels*((starty+y)*width+startx+x)+G] =
				CLAMP(0,paint_colors[block_mask[x][y]][G],255); // GREEN
			img[channels*((starty+y)*width+startx+x)+B] =
				CLAMP(0,paint_colors[block_mask[x][y]][B],255); // BLUE
		}
	}
}